

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_CursorEnterCallback(GLFWwindow *window,int entered)

{
  int iVar1;
  ImGuiContext *pIVar2;
  ImGuiIO *pIVar3;
  long *plVar4;
  float x;
  float y;
  
  pIVar2 = ImGui::GetCurrentContext();
  if (pIVar2 == (ImGuiContext *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    pIVar3 = ImGui::GetIO();
    plVar4 = (long *)pIVar3->BackendPlatformUserData;
  }
  if (((code *)plVar4[0x11] != (code *)0x0) && ((GLFWwindow *)*plVar4 == window)) {
    (*(code *)plVar4[0x11])(window,entered);
  }
  iVar1 = glfwGetInputMode(window,0x33001);
  if (iVar1 != 0x34003) {
    pIVar3 = ImGui::GetIO();
    if (entered == 0) {
      if ((GLFWwindow *)plVar4[3] != window) {
        return;
      }
      *(ImVec2 *)(plVar4 + 0xd) = pIVar3->MousePos;
      plVar4[3] = 0;
      x = -3.4028235e+38;
      y = -3.4028235e+38;
    }
    else {
      plVar4[3] = (long)window;
      x = *(float *)(plVar4 + 0xd);
      y = *(float *)((long)plVar4 + 0x6c);
    }
    ImGuiIO::AddMousePosEvent(pIVar3,x,y);
    return;
  }
  return;
}

Assistant:

void ImGui_ImplGlfw_CursorEnterCallback(GLFWwindow* window, int entered)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if (bd->PrevUserCallbackCursorEnter != nullptr && window == bd->Window)
        bd->PrevUserCallbackCursorEnter(window, entered);
    if (glfwGetInputMode(window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
        return;

    ImGuiIO& io = ImGui::GetIO();
    if (entered)
    {
        bd->MouseWindow = window;
        io.AddMousePosEvent(bd->LastValidMousePos.x, bd->LastValidMousePos.y);
    }
    else if (!entered && bd->MouseWindow == window)
    {
        bd->LastValidMousePos = io.MousePos;
        bd->MouseWindow = nullptr;
        io.AddMousePosEvent(-FLT_MAX, -FLT_MAX);
    }
}